

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall QApplicationPrivate::notifyWindowIconChanged(QApplicationPrivate *this)

{
  QWidget *pQVar1;
  bool bVar2;
  const_iterator o;
  QWidget **ppQVar3;
  QList<QWindow_*> *this_00;
  qsizetype qVar4;
  const_reference ppQVar5;
  long in_FS_OFFSET;
  int i;
  QWidget *w;
  QWidgetList *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QWindowList windowList;
  QWidgetList list;
  QEvent ev;
  QWindow **in_stack_ffffffffffffff68;
  QWidget *in_stack_ffffffffffffff70;
  int local_84;
  const_iterator local_50;
  QList<QWindow_*> local_48;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_18,ApplicationWindowIconChange);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::topLevelWidgets();
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::topLevelWindows();
  local_50.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = QList<QWidget_*>::begin((QList<QWidget_*> *)in_stack_ffffffffffffff70);
  o = QList<QWidget_*>::end((QList<QWidget_*> *)in_stack_ffffffffffffff70);
  while( true ) {
    bVar2 = QList<QWidget_*>::const_iterator::operator!=(&local_50,o);
    if (!bVar2) break;
    ppQVar3 = QList<QWidget_*>::const_iterator::operator*(&local_50);
    pQVar1 = *ppQVar3;
    QWidget::windowHandle(in_stack_ffffffffffffff70);
    QList<QWindow*>::removeOne<QWindow*>
              ((QList<QWindow_*> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QCoreApplication::sendEvent(&pQVar1->super_QObject,(QEvent *)&local_18);
    QList<QWidget_*>::const_iterator::operator++(&local_50);
  }
  local_84 = 0;
  while( true ) {
    this_00 = (QList<QWindow_*> *)(long)local_84;
    qVar4 = QList<QWindow_*>::size(&local_48);
    if (qVar4 <= (long)this_00) break;
    ppQVar5 = QList<QWindow_*>::at(this_00,(qsizetype)in_stack_ffffffffffffff68);
    QCoreApplication::sendEvent((QObject *)*ppQVar5,(QEvent *)&local_18);
    local_84 = local_84 + 1;
  }
  QList<QWindow_*>::~QList((QList<QWindow_*> *)0x2cc458);
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2cc462);
  QEvent::~QEvent((QEvent *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::notifyWindowIconChanged()
{
    QEvent ev(QEvent::ApplicationWindowIconChange);
    const QWidgetList list = QApplication::topLevelWidgets();
    QWindowList windowList = QGuiApplication::topLevelWindows();

    // send to all top-level QWidgets
    for (auto *w : list) {
        windowList.removeOne(w->windowHandle());
        QCoreApplication::sendEvent(w, &ev);
    }

    // in case there are any plain QWindows in this QApplication-using
    // application, also send the notification to them
    for (int i = 0; i < windowList.size(); ++i)
        QCoreApplication::sendEvent(windowList.at(i), &ev);
}